

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O0

int Ifn_NtkParseInt2(char *pStr,Ifn_Ntk_t *p)

{
  int iVar1;
  uint uVar2;
  char local_39;
  char Next;
  int iFan;
  int nFans;
  int f;
  int n;
  int k;
  int i;
  Ifn_Ntk_t *p_local;
  char *pStr_local;
  
  iVar1 = Ifn_ManStrCheck2(pStr,&p->nInps,&p->nObjs);
  if (iVar1 == 0) {
    pStr_local._4_4_ = 0;
  }
  else if (p->nInps < 0xc) {
    if ((((p->nInps < 2) || (p->nObjs <= p->nInps)) || (0xb < p->nInps)) || (0x15 < p->nObjs)) {
      __assert_fail("p->nInps > 1 && p->nInps < p->nObjs && p->nInps <= IFN_INS && p->nObjs < 2*IFN_INS"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifTune.c"
                    ,0x181,"int Ifn_NtkParseInt2(char *, Ifn_Ntk_t *)");
    }
    for (n = p->nInps; n < p->nObjs; n = n + 1) {
      f = 0;
      while ((pStr[f] != '\0' && (((int)pStr[f] != n + 0x61 || (pStr[f + 1] != '='))))) {
        f = f + 1;
      }
      if (pStr[f] == '\0') {
        iVar1 = Ifn_ErrorMessage("Cannot find definition of signal \'%c\'.\n",(ulong)(n + 0x61));
        return iVar1;
      }
      if (pStr[f + 2] == '(') {
        *(uint *)(p->Nodes + n) = *(uint *)(p->Nodes + n) & 0xfffffff8 | 3;
        local_39 = ')';
      }
      else if (pStr[f + 2] == '[') {
        *(uint *)(p->Nodes + n) = *(uint *)(p->Nodes + n) & 0xfffffff8 | 4;
        local_39 = ']';
      }
      else if (pStr[f + 2] == '<') {
        *(uint *)(p->Nodes + n) = *(uint *)(p->Nodes + n) & 0xfffffff8 | 5;
        local_39 = '>';
      }
      else {
        if (pStr[f + 2] != '{') {
          iVar1 = Ifn_ErrorMessage("Cannot find openning operation symbol in the definition of signal \'%c\'.\n"
                                   ,(ulong)(n + 0x61));
          return iVar1;
        }
        *(uint *)(p->Nodes + n) = *(uint *)(p->Nodes + n) & 0xfffffff8 | 6;
        local_39 = '}';
      }
      for (nFans = f + 3; (pStr[nFans] != '\0' && (pStr[nFans] != local_39)); nFans = nFans + 1) {
      }
      if (pStr[nFans] == '\0') {
        iVar1 = Ifn_ErrorMessage("Cannot find closing operation symbol in the definition of signal \'%c\'.\n"
                                 ,(ulong)(n + 0x61));
        return iVar1;
      }
      uVar2 = (nFans - f) - 3;
      if (8 < (int)uVar2) {
        iVar1 = Ifn_ErrorMessage("Cannot find matching operation symbol in the definition of signal \'%c\'.\n"
                                 ,(ulong)(n + 0x61));
        return iVar1;
      }
      for (iFan = 0; iFan < (int)uVar2; iFan = iFan + 1) {
        iVar1 = pStr[f + 3 + iFan] + -0x61;
        if ((iVar1 < 0) || (n <= iVar1)) {
          iVar1 = Ifn_ErrorMessage("Fanin number %d is signal %d is out of range.\n",
                                   (ulong)(uint)iFan,(ulong)(n + 0x61));
          return iVar1;
        }
        p->Nodes[n].Fanins[iFan] = iVar1;
      }
      *(uint *)(p->Nodes + n) = *(uint *)(p->Nodes + n) & 0xffffff07 | (uVar2 & 0x1f) << 3;
    }
    pStr_local._4_4_ = 1;
  }
  else {
    pStr_local._4_4_ =
         Ifn_ErrorMessage("The number of variables (%d) exceeds predefined limit (%d). Recompile with different value of IFN_INS.\n"
                          ,(ulong)(uint)p->nInps,0xb);
  }
  return pStr_local._4_4_;
}

Assistant:

int Ifn_NtkParseInt2( char * pStr, Ifn_Ntk_t * p )
{
    int i, k, n, f, nFans, iFan;
    if ( !Ifn_ManStrCheck2(pStr, &p->nInps, &p->nObjs) )
        return 0;
    if ( p->nInps > IFN_INS )
        return Ifn_ErrorMessage( "The number of variables (%d) exceeds predefined limit (%d). Recompile with different value of IFN_INS.\n", p->nInps, IFN_INS );
    assert( p->nInps > 1 && p->nInps < p->nObjs && p->nInps <= IFN_INS && p->nObjs < 2*IFN_INS );
    for ( i = p->nInps; i < p->nObjs; i++ )
    {
        char Next = 0;
        for ( k = 0; pStr[k]; k++ )
            if ( pStr[k] == 'a' + i && pStr[k+1] == '=' )
                break;
        if ( pStr[k] == 0 )
            return Ifn_ErrorMessage( "Cannot find definition of signal \'%c\'.\n", 'a' + i );
        if ( pStr[k+2] == '(' )
            p->Nodes[i].Type = IFN_DSD_AND, Next = ')';
        else if ( pStr[k+2] == '[' )
            p->Nodes[i].Type = IFN_DSD_XOR, Next = ']';
        else if ( pStr[k+2] == '<' )
            p->Nodes[i].Type = IFN_DSD_MUX, Next = '>';
        else if ( pStr[k+2] == '{' )
            p->Nodes[i].Type = IFN_DSD_PRIME, Next = '}';
        else 
            return Ifn_ErrorMessage( "Cannot find openning operation symbol in the definition of signal \'%c\'.\n", 'a' + i );
        for ( n = k + 3; pStr[n]; n++ )
            if ( pStr[n] == Next )
                break;
        if ( pStr[n] == 0 )
            return Ifn_ErrorMessage( "Cannot find closing operation symbol in the definition of signal \'%c\'.\n", 'a' + i );
        nFans = n - k - 3;
        if ( nFans > 8 )
            return Ifn_ErrorMessage( "Cannot find matching operation symbol in the definition of signal \'%c\'.\n", 'a' + i );
        for ( f = 0; f < nFans; f++ )
        {
            iFan = pStr[k + 3 + f] - 'a';
            if ( iFan < 0 || iFan >= i )
                return Ifn_ErrorMessage( "Fanin number %d is signal %d is out of range.\n", f, 'a' + i );
            p->Nodes[i].Fanins[f] = iFan;
        }
        p->Nodes[i].nFanins = nFans;
    }
    return 1;
}